

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_push(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap_00;
  int iVar1;
  sxi32 sVar2;
  int local_38;
  int i;
  sxi32 rc;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_int(pCtx,0);
  }
  else {
    iVar1 = jx9_value_is_json_array(*apArg);
    if (iVar1 == 0) {
      jx9_result_int(pCtx,0);
    }
    else {
      pMap_00 = (jx9_hashmap *)((*apArg)->x).pOther;
      local_38 = 1;
      while ((local_38 < nArg &&
             (sVar2 = jx9HashmapInsert(pMap_00,(jx9_value *)0x0,apArg[local_38]), sVar2 == 0))) {
        local_38 = local_38 + 1;
      }
      jx9_result_int64(pCtx,(ulong)pMap_00->nEntry);
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_push(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	sxi32 rc;
	int i;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Start pushing given values */
	for( i = 1 ; i < nArg ; ++i ){
		rc = jx9HashmapInsert(pMap, 0, apArg[i]);
		if( rc != SXRET_OK ){
			break;
		}
	}
	/* Return the new count */
	jx9_result_int64(pCtx, (sxi64)pMap->nEntry);
	return JX9_OK;
}